

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_comparison_expression.cpp
# Opt level: O1

LogicalType *
duckdb::ExpressionBinder::GetExpressionReturnType
          (LogicalType *__return_storage_ptr__,Expression *expr)

{
  LogicalType *this;
  bool bVar1;
  BoundConstantExpression *pBVar2;
  LogicalType *type;
  LogicalType local_60;
  string local_48;
  
  if ((expr->super_BaseExpression).expression_class == BOUND_CONSTANT) {
    this = &expr->return_type;
    LogicalType::LogicalType(&local_60,VARCHAR);
    bVar1 = LogicalType::operator==(this,&local_60);
    if (bVar1) {
      StringType::GetCollation_abi_cxx11_(&local_48,(StringType *)this,type);
      bVar1 = local_48._M_string_length == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    else {
      bVar1 = false;
    }
    LogicalType::~LogicalType(&local_60);
    if (bVar1) {
      LogicalType::LogicalType(__return_storage_ptr__,STRING_LITERAL);
      return __return_storage_ptr__;
    }
    bVar1 = LogicalType::IsIntegral(this);
    if ((bVar1) &&
       (pBVar2 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&expr->super_BaseExpression),
       (pBVar2->value).is_null == false)) {
      LogicalType::INTEGER_LITERAL(__return_storage_ptr__,&pBVar2->value);
      return __return_storage_ptr__;
    }
  }
  LogicalType::LogicalType(__return_storage_ptr__,&expr->return_type);
  return __return_storage_ptr__;
}

Assistant:

LogicalType ExpressionBinder::GetExpressionReturnType(const Expression &expr) {
	if (expr.GetExpressionClass() == ExpressionClass::BOUND_CONSTANT) {
		if (expr.return_type == LogicalTypeId::VARCHAR && StringType::GetCollation(expr.return_type).empty()) {
			return LogicalTypeId::STRING_LITERAL;
		}
		if (expr.return_type.IsIntegral()) {
			auto &constant = expr.Cast<BoundConstantExpression>();
			if (!constant.value.IsNull()) {
				return LogicalType::INTEGER_LITERAL(constant.value);
			}
		}
	}
	return expr.return_type;
}